

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

GetDefaultBlindingKeyRequestStruct * __thiscall
cfd::js::api::json::GetDefaultBlindingKeyRequest::ConvertToStruct
          (GetDefaultBlindingKeyRequestStruct *__return_storage_ptr__,
          GetDefaultBlindingKeyRequest *this)

{
  GetDefaultBlindingKeyRequest *this_local;
  GetDefaultBlindingKeyRequestStruct *result;
  
  GetDefaultBlindingKeyRequestStruct::GetDefaultBlindingKeyRequestStruct(__return_storage_ptr__);
  std::__cxx11::string::operator=
            ((string *)__return_storage_ptr__,(string *)&this->master_blinding_key_);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->locking_script,(string *)&this->locking_script_);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->address,(string *)&this->address_);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&__return_storage_ptr__->ignore_items,&this->ignore_items);
  return __return_storage_ptr__;
}

Assistant:

GetDefaultBlindingKeyRequestStruct GetDefaultBlindingKeyRequest::ConvertToStruct() const {  // NOLINT
  GetDefaultBlindingKeyRequestStruct result;
  result.master_blinding_key = master_blinding_key_;
  result.locking_script = locking_script_;
  result.address = address_;
  result.ignore_items = ignore_items;
  return result;
}